

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O2

void anon_unknown.dwarf_267407::debug_service_register(Caliper *c,Channel *chn)

{
  Events *pEVar1;
  ostream *poVar2;
  string local_360;
  code *local_340 [2];
  code *local_330;
  code *local_328;
  code *local_320 [2];
  code *local_310;
  code *local_308;
  code *local_300 [2];
  code *local_2f0;
  code *local_2e8;
  code *local_2e0 [2];
  code *local_2d0;
  code *local_2c8;
  code *local_2c0 [2];
  code *local_2b0;
  code *local_2a8;
  code *local_2a0 [2];
  code *local_290;
  code *local_288;
  code *local_280 [2];
  code *local_270;
  code *local_268;
  code *local_260 [2];
  code *local_250;
  code *local_248;
  code *local_240 [2];
  code *local_230;
  code *local_228;
  Log local_220;
  
  pEVar1 = cali::Channel::events(chn);
  local_240[1] = (code *)0x0;
  local_240[0] = create_attr_cb;
  local_228 = std::
              _Function_handler<void_(cali::Caliper_*,_const_cali::Attribute_&),_void_(*)(cali::Caliper_*,_const_cali::Attribute_&)>
              ::_M_invoke;
  local_230 = std::
              _Function_handler<void_(cali::Caliper_*,_const_cali::Attribute_&),_void_(*)(cali::Caliper_*,_const_cali::Attribute_&)>
              ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_const_cali::Attribute_&)>,_std::allocator<std::function<void_(cali::Caliper_*,_const_cali::Attribute_&)>_>_>
  ::push_back((vector<std::function<void_(cali::Caliper_*,_const_cali::Attribute_&)>,_std::allocator<std::function<void_(cali::Caliper_*,_const_cali::Attribute_&)>_>_>
               *)pEVar1,(value_type *)local_240);
  std::_Function_base::~_Function_base((_Function_base *)local_240);
  pEVar1 = cali::Channel::events(chn);
  local_260[1] = (code *)0x0;
  local_260[0] = begin_cb;
  local_248 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&),_void_(*)(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
              ::_M_invoke;
  local_250 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&),_void_(*)(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
              ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>_>_>
  ::push_back(&(pEVar1->pre_begin_evt).mCb,(value_type *)local_260);
  std::_Function_base::~_Function_base((_Function_base *)local_260);
  pEVar1 = cali::Channel::events(chn);
  local_280[1] = (code *)0x0;
  local_280[0] = end_cb;
  local_268 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&),_void_(*)(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
              ::_M_invoke;
  local_270 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&),_void_(*)(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
              ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>_>_>
  ::push_back(&(pEVar1->pre_end_evt).mCb,(value_type *)local_280);
  std::_Function_base::~_Function_base((_Function_base *)local_280);
  pEVar1 = cali::Channel::events(chn);
  local_2a0[1] = (code *)0x0;
  local_2a0[0] = set_cb;
  local_288 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&),_void_(*)(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
              ::_M_invoke;
  local_290 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&),_void_(*)(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
              ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>_>_>
  ::push_back(&(pEVar1->pre_set_evt).mCb,(value_type *)local_2a0);
  std::_Function_base::~_Function_base((_Function_base *)local_2a0);
  pEVar1 = cali::Channel::events(chn);
  local_2c0[1] = (code *)0x0;
  local_2c0[0] = finish_cb;
  local_2a8 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
              ::_M_invoke;
  local_2b0 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
              ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar1->finish_evt).mCb,(value_type *)local_2c0);
  std::_Function_base::~_Function_base((_Function_base *)local_2c0);
  pEVar1 = cali::Channel::events(chn);
  local_2e0[1] = (code *)0x0;
  local_2e0[0] = create_thread_cb;
  local_2c8 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
              ::_M_invoke;
  local_2d0 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
              ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar1->create_thread_evt).mCb,(value_type *)local_2e0);
  std::_Function_base::~_Function_base((_Function_base *)local_2e0);
  pEVar1 = cali::Channel::events(chn);
  local_300[1] = (code *)0x0;
  local_300[0] = release_thread_cb;
  local_2e8 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
              ::_M_invoke;
  local_2f0 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
              ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar1->release_thread_evt).mCb,(value_type *)local_300);
  std::_Function_base::~_Function_base((_Function_base *)local_300);
  pEVar1 = cali::Channel::events(chn);
  local_320[1] = (code *)0x0;
  local_320[0] = snapshot_cb;
  local_308 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&),_void_(*)(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&)>
              ::_M_invoke;
  local_310 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&),_void_(*)(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&)>
              ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&)>_>_>
  ::push_back(&(pEVar1->snapshot).mCb,(value_type *)local_320);
  std::_Function_base::~_Function_base((_Function_base *)local_320);
  pEVar1 = cali::Channel::events(chn);
  local_340[1] = (code *)0x0;
  local_340[0] = process_snapshot_cb;
  local_328 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView),_void_(*)(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>
              ::_M_invoke;
  local_330 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView),_void_(*)(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>
              ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>_>_>
  ::push_back(&(pEVar1->process_snapshot).mCb,(value_type *)local_340);
  std::_Function_base::~_Function_base((_Function_base *)local_340);
  std::ofstream::ofstream(&local_220);
  local_220.m_level = 1;
  poVar2 = cali::Log::stream(&local_220);
  cali::Channel::name_abi_cxx11_(&local_360,chn);
  poVar2 = std::operator<<(poVar2,(string *)&local_360);
  poVar2 = std::operator<<(poVar2,": Registered debug service");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_360);
  std::ofstream::~ofstream(&local_220);
  return;
}

Assistant:

void debug_service_register(Caliper* c, Channel* chn)
{
    chn->events().create_attr_evt.connect(&create_attr_cb);
    chn->events().pre_begin_evt.connect(&begin_cb);
    chn->events().pre_end_evt.connect(&end_cb);
    chn->events().pre_set_evt.connect(&set_cb);
    chn->events().finish_evt.connect(&finish_cb);
    chn->events().create_thread_evt.connect(&create_thread_cb);
    chn->events().release_thread_evt.connect(&release_thread_cb);
    chn->events().snapshot.connect(&snapshot_cb);
    chn->events().process_snapshot.connect(&process_snapshot_cb);

    Log(1).stream() << chn->name() << ": Registered debug service" << std::endl;
}